

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

void __thiscall
helics::apps::Echo::loadJsonFile
          (Echo *this,string *jsonFile,bool enableFederateInterfaceRegistration)

{
  bool bVar1;
  int iVar2;
  Endpoint *__args;
  reference pvVar3;
  Time TVar4;
  _Elt_pointer pEVar5;
  int index;
  json doc;
  value_type echoConfig;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&doc,"echo",(allocator<char> *)&echoConfig);
  App::loadJsonFileConfiguration
            (&this->super_App,(string *)&doc,jsonFile,enableFederateInterfaceRegistration);
  std::__cxx11::string::~string((string *)&doc);
  iVar2 = helics::MessageFederate::getEndpointCount
                    ((MessageFederate *)
                     &(((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate).field_0x10);
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    __args = helics::MessageFederate::getEndpoint
                       ((MessageFederate *)
                        &(((this->super_App).fed.
                           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->super_ValueFederate).field_0x10,index);
    std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
              ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,__args);
    pEVar5 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pEVar5 == (this->endpoints).
                  super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pEVar5 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 4;
    }
    doc.m_data.m_value.object = (object_t *)0x0;
    doc.m_data._0_8_ = this;
    Endpoint::setCallback
              (pEVar5 + -1,
               (function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
                *)&doc);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&doc);
  }
  fileops::loadJson((fileops *)&doc,(string *)jsonFile);
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::contains<const_char_(&)[5],_0>(&doc,(char (*) [5])"echo");
  if (bVar1) {
    pvVar3 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&doc,"echo");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&echoConfig,pvVar3);
    bVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::contains<const_char_(&)[6],_0>(&echoConfig,(char (*) [6])0x35d5cb);
    if (bVar1) {
      CLI::std::mutex::lock(&this->delayTimeLock);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&echoConfig,"delay");
      TVar4 = fileops::loadJsonTime(pvVar3,sec);
      (this->delayTime).internalTimeCode = TVar4.internalTimeCode;
      pthread_mutex_unlock((pthread_mutex_t *)&this->delayTimeLock);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&echoConfig.m_data);
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&doc.m_data);
  return;
}

Assistant:

void Echo::loadJsonFile(const std::string& jsonFile, bool enableFederateInterfaceRegistration)
    {
        loadJsonFileConfiguration("echo", jsonFile, enableFederateInterfaceRegistration);
        auto eptCount = fed->getEndpointCount();
        for (int ii = 0; ii < eptCount; ++ii) {
            endpoints.emplace_back(fed->getEndpoint(ii));
            endpoints.back().setCallback(
                [this](const Endpoint& ept, Time messageTime) { echoMessage(ept, messageTime); });
        }

        auto doc = fileops::loadJson(jsonFile);

        if (doc.contains("echo")) {
            auto echoConfig = doc["echo"];

            if (echoConfig.contains("delay")) {
                std::lock_guard<std::mutex> lock(delayTimeLock);
                delayTime = fileops::loadJsonTime(echoConfig["delay"]);
            }
        }
    }